

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image<unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          CImg<unsigned_char> *mask,float opacity,float mask_max_value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  uchar *puVar7;
  CImgArgumentException *this_00;
  uchar *puVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int y;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uchar *puVar27;
  float fVar28;
  CImg<unsigned_char> local_50;
  
  uVar11 = (ulong)(uint)z0;
  bVar6 = is_empty(this);
  if (((!bVar6) && (sprite->_data != (uchar *)0x0)) && (mask->_data != (uchar *)0x0)) {
    bVar6 = is_overlapped<unsigned_char>(this,sprite);
    if (bVar6) {
      operator+(&local_50,sprite);
      this = draw_image<unsigned_char,unsigned_char>
                       (this,x0,y0,z0,c0,&local_50,mask,opacity,mask_max_value);
    }
    else {
      bVar6 = is_overlapped<unsigned_char>(this,mask);
      if (!bVar6) {
        uVar1 = mask->_width;
        uVar26 = (ulong)uVar1;
        if (uVar1 == sprite->_width) {
          uVar2 = mask->_height;
          if ((uVar2 == sprite->_height) && (uVar3 = mask->_depth, uVar3 == sprite->_depth)) {
            uVar9 = this->_width;
            uVar14 = (ulong)uVar9;
            uVar4 = this->_height;
            iVar13 = uVar9 - (uVar1 + x0);
            if ((int)(uVar1 + x0) <= (int)uVar9) {
              iVar13 = 0;
            }
            uVar9 = x0 >> 0x1f & x0;
            iVar13 = iVar13 + uVar9 + uVar1;
            iVar15 = uVar4 - (uVar2 + y0);
            if ((int)(uVar2 + y0) <= (int)uVar4) {
              iVar15 = 0;
            }
            uVar5 = this->_depth;
            iVar17 = uVar5 - (z0 + uVar3);
            if ((int)(z0 + uVar3) <= (int)uVar5) {
              iVar17 = 0;
            }
            iVar10 = sprite->_spectrum + c0;
            iVar16 = this->_spectrum - iVar10;
            if (iVar10 <= (int)this->_spectrum) {
              iVar16 = 0;
            }
            if (iVar13 < 1) {
              return this;
            }
            iVar15 = (y0 >> 0x1f & y0) + uVar2 + iVar15;
            if (iVar15 < 1) {
              return this;
            }
            iVar17 = (z0 >> 0x1f & z0) + uVar3 + iVar17;
            if (iVar17 < 1) {
              return this;
            }
            uVar24 = sprite->_spectrum + (c0 >> 0x1f & c0) + iVar16;
            if ((int)uVar24 < 1) {
              return this;
            }
            lVar18 = uVar26 - (long)iVar13;
            lVar22 = (ulong)(uVar3 - iVar17) * uVar2 * uVar26;
            lVar23 = (uVar2 - iVar15) * uVar26;
            iVar10 = -((z0 >> 0x1f & uVar1 * z0 * uVar2) + uVar9 + (y0 >> 0x1f & uVar1 * y0) +
                      (c0 >> 0x1f & uVar3 * uVar2 * uVar1 * c0));
            puVar7 = mask->_data + iVar10;
            puVar8 = sprite->_data + iVar10;
            uVar9 = mask->_spectrum;
            lVar19 = uVar4 * uVar14;
            uVar25 = 0;
            uVar26 = (ulong)(uint)x0;
            if (x0 < 1) {
              uVar26 = 0;
            }
            uVar12 = (ulong)(uint)y0;
            if (y0 < 1) {
              uVar12 = 0;
            }
            if (z0 < 1) {
              uVar11 = 0;
            }
            if (c0 < 1) {
              c0 = uVar25;
            }
            puVar27 = this->_data +
                      (ulong)(uint)c0 * (ulong)uVar5 * lVar19 +
                      uVar11 * lVar19 + uVar12 * uVar14 + uVar26;
            for (; uVar25 != uVar24; uVar25 = uVar25 + 1) {
              puVar7 = mask->_data +
                       ((long)puVar7 - (long)mask->_data) %
                       ((long)(int)(uVar2 * uVar1 * uVar3) * (long)(int)uVar9);
              for (iVar10 = 0; iVar10 != iVar17; iVar10 = iVar10 + 1) {
                for (iVar16 = 0; iVar16 != iVar15; iVar16 = iVar16 + 1) {
                  for (lVar20 = 0; iVar13 != (int)lVar20; lVar20 = lVar20 + 1) {
                    fVar28 = (float)puVar7[lVar20] * opacity;
                    puVar27[lVar20] =
                         (uchar)(int)(((float)puVar8[lVar20] * ABS(fVar28) +
                                      (float)puVar27[lVar20] *
                                      (mask_max_value -
                                      (float)(-(uint)(0.0 <= fVar28) & (uint)fVar28))) /
                                     mask_max_value);
                  }
                  puVar27 = puVar27 + lVar20 + (uVar14 - (long)iVar13);
                  puVar8 = puVar8 + lVar20 + lVar18;
                  puVar7 = puVar7 + lVar20 + lVar18;
                }
                puVar27 = puVar27 + (uVar4 - iVar15) * uVar14;
                puVar8 = puVar8 + lVar23;
                puVar7 = puVar7 + lVar23;
              }
              puVar27 = puVar27 + (ulong)(uVar5 - iVar17) * lVar19;
              puVar8 = puVar8 + lVar22;
              puVar7 = puVar7 + lVar22;
            }
            return this;
          }
        }
        this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
        pcVar21 = "non-";
        if (this->_is_shared != false) {
          pcVar21 = "";
        }
        CImgArgumentException::CImgArgumentException
                  (this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar21,"unsigned char",(ulong)sprite->_width,
                   (ulong)sprite->_height,(ulong)sprite->_depth,(ulong)sprite->_spectrum,
                   sprite->_data,(ulong)mask->_width,(ulong)mask->_height,(ulong)mask->_depth,
                   (ulong)mask->_spectrum,mask->_data);
        __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
      }
      operator+(&local_50,mask);
      this = draw_image<unsigned_char,unsigned_char>
                       (this,x0,y0,z0,c0,sprite,&local_50,opacity,mask_max_value);
    }
    ~CImg(&local_50);
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<ti>& sprite, const CImg<tm>& mask, const float opacity=1,
                        const float mask_max_value=1) {
      if (is_empty() || !sprite || !mask) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,mask,opacity,mask_max_value);
      if (is_overlapped(mask))   return draw_image(x0,y0,z0,c0,sprite,+mask,opacity,mask_max_value);
      if (mask._width!=sprite._width || mask._height!=sprite._height || mask._depth!=sprite._depth)
        throw CImgArgumentException(_cimg_instance
                                    "draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions.",
                                    cimg_instance,
                                    sprite._width,sprite._height,sprite._depth,sprite._spectrum,sprite._data,
                                    mask._width,mask._height,mask._depth,mask._spectrum,mask._data);

      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const int
        coff = -(bx?x0:0)-(by?y0*mask.width():0)-(bz?z0*mask.width()*mask.height():0)-(bc?c0*mask.width()*mask.height()*mask.depth():0),
        ssize = mask.width()*mask.height()*mask.depth()*mask.spectrum();
      const ti *ptrs = sprite._data + coff;
      const tm *ptrm = mask._data   + coff;
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
	T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int c = 0; c<lC; ++c) {
          ptrm = mask._data + (ptrm - mask._data)%ssize;
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              for (int x = 0; x<lX; ++x) {
                const float mopacity = (float)(*(ptrm++)*opacity),
                  nopacity = cimg::abs(mopacity), copacity = mask_max_value - cimg::max(mopacity,0);
                *ptrd = (T)((nopacity*(*(ptrs++)) + *ptrd*copacity)/mask_max_value);
                ++ptrd;
              }
              ptrd+=offX; ptrs+=soffX; ptrm+=soffX;
            }
            ptrd+=offY; ptrs+=soffY; ptrm+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ; ptrm+=soffZ;
        }
      }
      return *this;
    }